

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cluster.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  double dVar1;
  size_t sVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  Vector *pVVar6;
  unsigned_long uVar7;
  char *pcVar8;
  undefined4 *puVar9;
  _Base_ptr p_Var10;
  char *s2;
  _Self _Var11;
  ulong *puVar12;
  undefined8 *puVar13;
  size_t sVar14;
  FILE *pFVar15;
  unsigned_long uVar16;
  long lVar17;
  unsigned_long ci;
  ulong uVar18;
  ambig_t aVar19;
  unsigned_long seq;
  ulong uVar20;
  ulong uVar21;
  sequence_gap_structure *psVar22;
  sequence_gap_structure *sequence_descriptor2;
  _Base_ptr p_Var23;
  unsigned_long p_1;
  const_iterator cVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  char automatonState;
  _Self __tmp;
  time_t before;
  ulong local_160;
  double local_158;
  undefined8 *local_150;
  time_t after;
  long firstSequenceLength;
  FILE *local_138;
  Clusters clusters;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> remaining;
  args_t args;
  set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> join_to;
  
  argparse::args_t::args_t(&args,argc,argv);
  firstSequenceLength = 0;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &remaining._M_t._M_impl.super__Rb_tree_header._M_header;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  remaining._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  Clusters::Clusters(&clusters);
  automatonState = '\0';
  Vector::appendValue(&nameLengths,0);
  Vector::appendValue(&seqLengths,0);
  initAlphabets(false,args.ambigs_to_resolve,false);
  iVar3 = readFASTA(args.input,&automatonState,&names,&sequences,&nameLengths,&seqLengths,
                    &firstSequenceLength,false,(Vector *)0x0,':',1.0,false);
  if (iVar3 == 1) {
    iVar3 = 1;
  }
  else {
    local_160 = seqLengths.vLength - 1;
    if (args.quiet == false) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Read ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," sequences from input file ");
      poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
      poVar4 = std::operator<<(poVar4,"Will perform approximately ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4," pairwise distance calculations");
    }
    uVar18 = local_160;
    resolve_fraction = args.resolve_fraction;
    local_150 = (undefined8 *)operator_new__(-(ulong)(local_160 >> 0x3b != 0) | local_160 * 0x20);
    if (local_160 != 0) {
      puVar13 = local_150;
      do {
        *puVar13 = 0x7fffffffffffffff;
        puVar13[3] = 0;
        puVar13[1] = 0;
        puVar13[2] = 0;
        puVar13 = puVar13 + 4;
      } while (puVar13 != local_150 + uVar18 * 4);
    }
    uVar18 = 0;
    while (before = uVar18, uVar18 < local_160) {
      pcVar5 = stringText(&sequences,&seqLengths,uVar18);
      describe_sequence((sequence_gap_structure *)&join_to,pcVar5,firstSequenceLength,4);
      local_150[before * 4 + 2] = join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      (local_150 + before * 4 + 2)[1] = join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left
      ;
      local_150[before * 4] = join_to._M_t._M_impl._0_8_;
      (local_150 + before * 4)[1] =
           CONCAT44(join_to._M_t._M_impl.super__Rb_tree_header._M_header._4_4_,
                    join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_color);
      if ((before != 0) || (uVar18 = 1, args.first_regular != false)) {
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::_M_insert_unique<unsigned_long_const&>
                  ((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                    *)&remaining,(unsigned_long *)&before);
        uVar18 = before + 1;
      }
    }
    if (args.quiet == false) {
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      std::operator<<(poVar4,"Progress: ");
    }
    aVar19 = resolve;
    if (args.ambig < (subset|average)) {
      aVar19 = args.ambig;
    }
    time(&before);
    local_138 = (FILE *)CONCAT44(local_138._4_4_,(int)(char)aVar19);
    dVar25 = ((double)CONCAT44(0x45300000,(int)(local_160 >> 0x20)) - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)local_160) - 4503599627370496.0);
    if (args.cluster_type == all) {
      cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)cVar24._M_node != &remaining._M_t._M_impl.super__Rb_tree_header) {
        uVar7 = *(unsigned_long *)(cVar24._M_node + 1);
        pcVar5 = stringText(&sequences,&seqLengths,uVar7);
        pVVar6 = Clusters::append_a_cluster(&clusters,uVar7);
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&remaining,cVar24);
        psVar22 = (sequence_gap_structure *)(local_150 + uVar7 * 4);
        _Var11._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while (cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
              (_Rb_tree_header *)_Var11._M_node != &remaining._M_t._M_impl.super__Rb_tree_header) {
          dVar1 = *(double *)(_Var11._M_node + 1);
          __tmp._M_node = _Var11._M_node;
          pcVar8 = stringText(&sequences,&seqLengths,(unsigned_long)dVar1);
          sequence_descriptor2 = (sequence_gap_structure *)(local_150 + (long)dVar1 * 4);
          local_158 = dVar1;
          dVar1 = computeTN93(pcVar5,pcVar8,firstSequenceLength,(char)local_138,(long *)0x0,
                              args.overlap,(unsigned_long *)0x0,200.0,200,1,1,psVar22,
                              sequence_descriptor2);
          uVar18 = 1;
          if (args.distance < dVar1) {
            puVar13 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar13 = 0;
            __cxa_throw(puVar13,&unsigned_long::typeinfo,0);
          }
          for (; uVar18 < pVVar6->vLength; uVar18 = uVar18 + 1) {
            uVar7 = Vector::value(pVVar6,uVar18);
            s2 = stringText(&sequences,&seqLengths,uVar7);
            dVar1 = computeTN93(pcVar8,s2,firstSequenceLength,(char)local_138,(long *)0x0,
                                args.overlap,(unsigned_long *)0x0,200.0,200,1,1,sequence_descriptor2
                                ,(sequence_gap_structure *)(local_150 + uVar7 * 4));
            if ((dVar1 < 0.0) || (args.distance < dVar1)) {
              puVar12 = (ulong *)__cxa_allocate_exception(8);
              *puVar12 = uVar18;
              __cxa_throw(puVar12,&unsigned_long::typeinfo,0);
            }
          }
          Vector::appendValue(pVVar6,(long)local_158);
          _Var11._M_node =
               (_Base_ptr)
               std::
               _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
               ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                                   *)&remaining,__tmp._M_node);
          if (args.quiet == false) {
            __tmp._M_node = _Var11._M_node;
            time(&after);
            dVar1 = difftime(after,before);
            sVar2 = remaining._M_t._M_impl.super__Rb_tree_header._M_node_count;
            _Var11 = __tmp;
            if (0.0 < dVar1) {
              local_158 = dVar1;
              poVar4 = std::operator<<((ostream *)&std::cerr,
                                       "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                      );
              lVar17 = local_160 - sVar2;
              auVar27._8_4_ = (int)((ulong)lVar17 >> 0x20);
              auVar27._0_8_ = lVar17;
              auVar27._12_4_ = 0x45300000;
              *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
              poVar4 = std::ostream::_M_insert<double>
                                 ((((auVar27._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0))
                                  * 100.0) / dVar25);
              poVar4 = std::operator<<(poVar4,"% (");
              *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
              poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
              poVar4 = std::operator<<(poVar4," clusters created, ");
              lVar17 = *(long *)poVar4;
              *(undefined8 *)(poVar4 + *(long *)(lVar17 + -0x18) + 0x10) = 0xc;
              *(undefined8 *)(poVar4 + *(long *)(lVar17 + -0x18) + 8) = 3;
              poVar4 = std::ostream::_M_insert<double>
                                 ((dVar25 - (((double)CONCAT44(0x45300000,
                                                               (int)(remaining._M_t._M_impl.
                                                                     super__Rb_tree_header.
                                                                     _M_node_count >> 0x20)) -
                                             1.9342813113834067e+25) +
                                            ((double)CONCAT44(0x43300000,
                                                              (int)remaining._M_t._M_impl.
                                                                   super__Rb_tree_header.
                                                                   _M_node_count) -
                                            4503599627370496.0))) / local_158);
              std::operator<<(poVar4," sequences clustered/sec)");
              after = before;
              _Var11 = __tmp;
            }
          }
        }
        if (args.quiet == false) {
          time(&after);
          p_Var23 = (_Base_ptr)difftime(after,before);
          sVar2 = remaining._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (0.0 < (double)p_Var23) {
            __tmp._M_node = p_Var23;
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                    );
            lVar17 = local_160 - sVar2;
            auVar28._8_4_ = (int)((ulong)lVar17 >> 0x20);
            auVar28._0_8_ = lVar17;
            auVar28._12_4_ = 0x45300000;
            *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
            poVar4 = std::ostream::_M_insert<double>
                               ((((auVar28._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) *
                                100.0) / dVar25);
            poVar4 = std::operator<<(poVar4,"% (");
            *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4," clusters created, ");
            lVar17 = *(long *)poVar4;
            *(undefined8 *)(poVar4 + *(long *)(lVar17 + -0x18) + 0x10) = 0xc;
            *(undefined8 *)(poVar4 + *(long *)(lVar17 + -0x18) + 8) = 3;
            poVar4 = std::ostream::_M_insert<double>
                               ((dVar25 - (((double)CONCAT44(0x45300000,
                                                             (int)(remaining._M_t._M_impl.
                                                                   super__Rb_tree_header.
                                                                   _M_node_count >> 0x20)) -
                                           1.9342813113834067e+25) +
                                          ((double)CONCAT44(0x43300000,
                                                            (int)remaining._M_t._M_impl.
                                                                 super__Rb_tree_header._M_node_count
                                                           ) - 4503599627370496.0))) /
                                (double)__tmp._M_node);
            std::operator<<(poVar4," sequences clustered/sec)");
            after = before;
          }
        }
      }
    }
    else {
      __tmp._M_node = (_Base_ptr)0x0;
      cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      while ((_Rb_tree_header *)cVar24._M_node != &remaining._M_t._M_impl.super__Rb_tree_header) {
        local_158 = *(double *)(cVar24._M_node + 1);
        pcVar5 = stringText(&sequences,&seqLengths,(unsigned_long)local_158);
        Clusters::remove_blanks(&clusters);
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
             &join_to._M_t._M_impl.super__Rb_tree_header._M_header;
        join_to._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
        join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
             join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        std::
        _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
        ::erase_abi_cxx11_((_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                            *)&remaining,cVar24);
        psVar22 = (sequence_gap_structure *)(local_150 + (long)local_158 * 4);
        for (uVar18 = 0; p_Var10 = join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
            uVar18 < clusters.cluster_count; uVar18 = uVar18 + 1) {
          pVVar6 = Clusters::operator[](&clusters,uVar18);
          uVar20 = 0;
          while (uVar20 < pVVar6->vLength) {
            uVar7 = Vector::value(pVVar6,uVar20);
            pcVar8 = stringText(&sequences,&seqLengths,uVar7);
            dVar1 = computeTN93(pcVar5,pcVar8,firstSequenceLength,(char)local_138,(long *)0x0,
                                args.overlap,(unsigned_long *)0x0,200.0,200,1,1,psVar22,
                                (sequence_gap_structure *)(local_150 + uVar7 * 4));
            uVar20 = uVar20 + 1;
            if ((0.0 <= dVar1) && (dVar1 <= args.distance)) {
              puVar9 = (undefined4 *)__cxa_allocate_exception(4);
              *puVar9 = 0;
              __cxa_throw(puVar9,&int::typeinfo,0);
            }
          }
        }
        if (join_to._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
          Clusters::append_a_cluster(&clusters,(unsigned_long)local_158);
        }
        else {
          uVar7 = *(unsigned_long *)
                   (join_to._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 1);
          pVVar6 = Clusters::operator[](&clusters,uVar7);
          Vector::appendValue(pVVar6,(long)local_158);
          while (p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10),
                (_Rb_tree_header *)p_Var10 != &join_to._M_t._M_impl.super__Rb_tree_header) {
            Clusters::merge_clusters(&clusters,uVar7,*(unsigned_long *)(p_Var10 + 1));
            __tmp._M_node = (_Base_ptr)((long)&(__tmp._M_node)->_M_color + 1);
          }
        }
        cVar24._M_node = remaining._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        if (args.quiet == false) {
          time(&after);
          dVar1 = difftime(after,before);
          sVar2 = remaining._M_t._M_impl.super__Rb_tree_header._M_node_count;
          if (0.0 < dVar1) {
            local_158 = dVar1;
            poVar4 = std::operator<<((ostream *)&std::cerr,
                                     "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
                                    );
            lVar17 = local_160 - sVar2;
            auVar26._8_4_ = (int)((ulong)lVar17 >> 0x20);
            auVar26._0_8_ = lVar17;
            auVar26._12_4_ = 0x45300000;
            *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
            poVar4 = std::ostream::_M_insert<double>
                               ((((auVar26._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)lVar17) - 4503599627370496.0)) *
                                100.0) / dVar25);
            poVar4 = std::operator<<(poVar4,"% (");
            *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4,"[");
            *(undefined8 *)(poVar4 + *(long *)(*(long *)poVar4 + -0x18) + 0x10) = 8;
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
            poVar4 = std::operator<<(poVar4,"] clusters created [merged], ");
            lVar17 = *(long *)poVar4;
            *(undefined8 *)(poVar4 + *(long *)(lVar17 + -0x18) + 0x10) = 0xc;
            *(undefined8 *)(poVar4 + *(long *)(lVar17 + -0x18) + 8) = 3;
            poVar4 = std::ostream::_M_insert<double>
                               ((dVar25 - (((double)CONCAT44(0x45300000,
                                                             (int)(remaining._M_t._M_impl.
                                                                   super__Rb_tree_header.
                                                                   _M_node_count >> 0x20)) -
                                           1.9342813113834067e+25) +
                                          ((double)CONCAT44(0x43300000,
                                                            (int)remaining._M_t._M_impl.
                                                                 super__Rb_tree_header._M_node_count
                                                           ) - 4503599627370496.0))) / local_158);
            std::operator<<(poVar4," sequences clustered/sec)");
            after = before;
          }
        }
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::~_Rb_tree(&join_to._M_t);
      }
    }
    if (args.quiet == false) {
      poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      poVar4 = std::operator<<(poVar4,"Created ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4," clusters");
      std::endl<char,std::char_traits<char>>(poVar4);
    }
    Clusters::remove_blanks(&clusters);
    if (args.output_mode == json) {
      pFVar15 = _stdout;
      if ((args.trunk_path != (char *)0x0) &&
         (pFVar15 = fopen(args.trunk_path,"w"), pFVar15 == (FILE *)0x0)) {
        poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to open \'");
        poVar4 = std::operator<<(poVar4,args.trunk_path);
        poVar4 = std::operator<<(poVar4,"\' for writing");
        std::endl<char,std::char_traits<char>>(poVar4);
LAB_00105658:
        exit(0);
      }
      fputc(0x5b,pFVar15);
      p_Var23 = (_Base_ptr)0x0;
      local_138 = pFVar15;
      while (p_Var23 < clusters.cluster_count) {
        pVVar6 = Clusters::operator[](&clusters,(unsigned_long)p_Var23);
        __tmp._M_node = p_Var23;
        if (p_Var23 != (_Base_ptr)0x0) {
          fputc(0x2c,pFVar15);
        }
        fprintf(pFVar15,"\n\t{\n\t\t\"size\" : %ld, \n\t\t\"members\" : [",pVVar6->vLength);
        uVar18 = 0;
        uVar7 = 0;
        for (uVar20 = 0; uVar20 < pVVar6->vLength; uVar20 = uVar20 + 1) {
          pcVar5 = ",\"%s\"";
          if (uVar20 == 0) {
            pcVar5 = "\"%s\"";
          }
          uVar16 = Vector::value(pVVar6,uVar20);
          pcVar8 = stringText(&names,&nameLengths,uVar16);
          fprintf(local_138,pcVar5,pcVar8);
          uVar16 = Vector::value(pVVar6,uVar20);
          pcVar5 = stringText(&sequences,&seqLengths,uVar16);
          uVar21 = 0;
          for (lVar17 = 0; firstSequenceLength != lVar17; lVar17 = lVar17 + 1) {
            uVar21 = uVar21 + (resolutionsCount[(byte)pcVar5[lVar17]] == 1.0);
          }
          if (uVar18 < uVar21) {
            uVar7 = Vector::value(pVVar6,uVar20);
            uVar18 = uVar21;
          }
        }
        pcVar5 = stringText(&names,&nameLengths,uVar7);
        pFVar15 = local_138;
        fprintf(local_138,"],\n\t\t\"centroid\" : \">%s\\n",pcVar5);
        pcVar5 = stringText(&sequences,&seqLengths,uVar7);
        dump_fasta(pcVar5,firstSequenceLength,(FILE *)pFVar15,false,false,0,0);
        fwrite("\\n\"\n\t}",6,1,pFVar15);
        p_Var23 = (_Base_ptr)((long)&(__tmp._M_node)->_M_color + 1);
      }
      fwrite("\n]\n",3,1,pFVar15);
      if (args.trunk_path != (char *)0x0) {
        fclose(pFVar15);
      }
    }
    else {
      if (args.trunk_path == (char *)0x0) {
        pcVar5 = (char *)0x0;
        sVar14 = 0;
      }
      else {
        sVar14 = strlen(args.trunk_path);
        sVar14 = sVar14 + 0x80;
        pcVar5 = (char *)operator_new__(sVar14);
      }
      for (uVar18 = 0; uVar18 < clusters.cluster_count; uVar18 = uVar18 + 1) {
        pVVar6 = Clusters::operator[](&clusters,uVar18);
        pFVar15 = _stdout;
        if (args.trunk_path == (char *)0x0) {
          poVar4 = std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
          poVar4 = std::operator<<(poVar4,"============================");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          snprintf(pcVar5,sVar14,"%s.%lu");
          pFVar15 = fopen(pcVar5,"w");
          if (pFVar15 == (FILE *)0x0) {
            poVar4 = std::operator<<((ostream *)&std::cerr,"Failed to open \'");
            poVar4 = std::operator<<(poVar4,pcVar5);
            poVar4 = std::operator<<(poVar4,"\' for writing");
            std::endl<char,std::char_traits<char>>(poVar4);
            goto LAB_00105658;
          }
        }
        for (uVar20 = 0; uVar20 < pVVar6->vLength; uVar20 = uVar20 + 1) {
          uVar7 = Vector::value(pVVar6,uVar20);
          dump_sequence_fasta(uVar7,(FILE *)pFVar15,firstSequenceLength,(double *)0x0,false,0,0);
        }
        if (args.trunk_path != (char *)0x0) {
          fclose(pFVar15);
        }
      }
      if ((pcVar5 != (char *)0x0) && (args.trunk_path != (char *)0x0)) {
        operator_delete__(pcVar5);
      }
    }
    operator_delete__(local_150);
    iVar3 = 0;
  }
  Clusters::~Clusters(&clusters);
  std::
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  ::~_Rb_tree(&remaining._M_t);
  argparse::args_t::~args_t(&args);
  return iVar3;
}

Assistant:

int main(int argc, const char *argv[]) {
  args_t args = args_t(argc, argv);

  long firstSequenceLength = 0;

  set<unsigned long> remaining; // sequence ids not yet clustered

  Clusters clusters;

  char automatonState = 0;
  // 0 - between sequences
  // 1 - reading sequence name
  // 2 - reading sequence

  nameLengths.appendValue(0);
  seqLengths.appendValue(0);

  initAlphabets(false, args.ambigs_to_resolve);
  if (readFASTA(args.input, automatonState, names, sequences, nameLengths,
                seqLengths, firstSequenceLength) == 1)
    return 1;

  unsigned long sequenceCount = seqLengths.length() - 1,
                pairwise = (sequenceCount - 1L) * (sequenceCount) / 2;

  if (!args.quiet) {
    cerr << "Read " << sequenceCount << " sequences from input file " << endl
         << "Will perform approximately " << pairwise
         << " pairwise distance calculations";
  }

  sequence_gap_structure *sequence_descriptors = NULL;

  resolve_fraction = args.resolve_fraction;

  double percentDone = 0.;

  sequence_descriptors = new sequence_gap_structure[sequenceCount];
  for (unsigned long sid = 0UL; sid < sequenceCount; sid++) {
    sequence_descriptors[sid] = describe_sequence(
        stringText(sequences, seqLengths, sid), firstSequenceLength);
    if (args.first_regular || sid > 0UL) {
      remaining.insert(sid);
    }
  }

  if (!args.quiet)
    cerr << endl << "Progress: ";

  int resolutionOption;
  switch (args.ambig) {
  case resolve:
    resolutionOption = RESOLVE;
    break;
  case average:
    resolutionOption = AVERAGE;
    break;
  case skip:
    resolutionOption = SKIP;
    break;
  case gapmm:
    resolutionOption = GAPMM;
    break;
  case subset:
    resolutionOption = SUBSET;
    break;
  }

  time_t before, after;
  time(&before);

  if (args.cluster_type == all) {

    auto outer_iterator = remaining.begin();

    while (outer_iterator != remaining.end()) {

      unsigned long seq1 = *outer_iterator;

      char *base_sequence = stringText(sequences, seqLengths, seq1);

      Vector *current_cluster = clusters.append_a_cluster(seq1);

      outer_iterator = remaining.erase(outer_iterator);

      auto inner_iterator = remaining.begin();

      while (inner_iterator != remaining.end()) {

        unsigned long seq2 = *inner_iterator;
        char *test_sequence = stringText(sequences, seqLengths, seq2);

        try {
          double distance = computeTN93(
              base_sequence, test_sequence, firstSequenceLength,
              resolutionOption, NULL, args.overlap, NULL, HISTOGRAM_SLICE,
              HISTOGRAM_BINS, 1L, 1L, &sequence_descriptors[seq1],
              &sequence_descriptors[seq2]);

          if (distance <= args.distance) {
            // check if this can be merged into the current cluster
            for (unsigned long current_cluster_seq = 1UL;
                 current_cluster_seq < current_cluster->length();
                 current_cluster_seq++) {
              unsigned long csi = current_cluster->value(current_cluster_seq);
              double d = computeTN93(
                  test_sequence, stringText(sequences, seqLengths, csi),
                  firstSequenceLength, resolutionOption, NULL, args.overlap,
                  NULL, HISTOGRAM_SLICE, HISTOGRAM_BINS, 1L, 1L,
                  &sequence_descriptors[seq2], &sequence_descriptors[csi]);
                if (d > args.distance || d < 0.) {
                    throw(current_cluster_seq);
                }
            }
          } else {
            throw(0UL);
          }
          current_cluster->appendValue(seq2);
          //cerr << "removing " << seq2 << " : " << remaining.size() << " / " << current_cluster->length() << endl;
          inner_iterator = remaining.erase(inner_iterator);
            if (!args.quiet) {
              time(&after);
              double dt = difftime(after, before);
              if (dt > 0.) {
                percentDone =
                    (sequenceCount - remaining.size()) * 100. / sequenceCount;
                cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                        "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                        "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                        ":"
                     << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
                     << " clusters created, " << setw(12) << std::setprecision(3)
                     << ((double)sequenceCount - remaining.size()) / dt
                     << " sequences clustered/sec)";

                after = before;
              }
            }
        } catch (unsigned long e) {
          //cerr << "mismatch at " << e << endl;
          inner_iterator++;
        }
      }

      outer_iterator = remaining.begin();
      if (!args.quiet) {
        time(&after);
        double dt = difftime(after, before);
        if (dt > 0.) {
          percentDone =
              (sequenceCount - remaining.size()) * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\bProgress"
                  ":"
               << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
               << " clusters created, " << setw(12) << std::setprecision(3)
               << ((double)sequenceCount - remaining.size()) / dt
               << " sequences clustered/sec)";

          after = before;
        }
      }
    }
  } else {
    auto outer_iterator = remaining.begin();

    // the idea here is to first iterate over all existing clusters
    // if the remaining sequence can be joined to some of the clusters,
    // then these clusters will be joined together and augmented with the new
    // sequence

    // failing that, the new sequence gets its own cluster

    unsigned long mergers = 0UL;

    while (outer_iterator != remaining.end()) {

      unsigned long seq1 = *outer_iterator;
      char *base_sequence = stringText(sequences, seqLengths, seq1);

      clusters.remove_blanks();

      set<unsigned long> join_to;

      outer_iterator = remaining.erase(outer_iterator);

#pragma omp parallel shared(clusters, sequence_descriptors, resolutionOption,  \
                            sequences, seqLengths, sequenceCount,              \
                            firstSequenceLength, args, nameLengths, names,     \
                            percentDone, cerr)
      for (unsigned long cc = 0UL; cc < clusters.size(); cc++) {
        Vector const *this_cluster = clusters[cc];

        try {
          for (unsigned long seq = 0UL; seq < this_cluster->length(); seq++) {
            unsigned long csi = this_cluster->value(seq);
            double d = computeTN93(
                base_sequence, stringText(sequences, seqLengths, csi),
                firstSequenceLength, resolutionOption, NULL, args.overlap, NULL,
                HISTOGRAM_SLICE, HISTOGRAM_BINS, 1L, 1L,
                &sequence_descriptors[seq1], &sequence_descriptors[csi]);
            if (d >= 0. && d <= args.distance) {
              throw(0);
            }
          }
        } catch (int e) {
#pragma omp critical
          join_to.insert(cc);
        }
      }

      if (join_to.empty()) {
        // create new cluster
        clusters.append_a_cluster(seq1);

      } else {
        auto cluster_iterator = join_to.begin();
        unsigned long first = *cluster_iterator;
        clusters[first]->appendValue(seq1);
        cluster_iterator++;
        while (cluster_iterator != join_to.end()) {
          // cout << "Merging " << first << " and " << *cluster_iterator << " on
          // " << seq1 << endl;
          clusters.merge_clusters(first, *cluster_iterator);
          mergers++;
          cluster_iterator++;
        }
      }

      outer_iterator = remaining.begin();
      if (!args.quiet) {
        time(&after);
        double dt = difftime(after, before);
        if (dt > 0.) {
          percentDone =
              (sequenceCount - remaining.size()) * 100. / sequenceCount;
          cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b"
                  "\b\b\b\b\b\b\b\b\b\b\b\b\bProgress:"
               << setw(8) << percentDone << "% (" << setw(8) << clusters.size()
               << "[" << setw(8) << mergers << "] clusters created [merged], "
               << setw(12) << std::setprecision(3)
               << ((double)sequenceCount - remaining.size()) / dt
               << " sequences clustered/sec)";

          after = before;
        }
      }
    }
  }

  if (!args.quiet) {
    cerr << endl << "Created " << clusters.size() << " clusters" << endl;
  }
  clusters.remove_blanks();

  if (args.output_mode == json) {
    FILE *print_to;

    if (args.trunk_path) {
      print_to = fopen(args.trunk_path, "w");
      if (!print_to) {
        cerr << "Failed to open '" << args.trunk_path << "' for writing"
             << endl;
        exit(0);
      }
    } else {
      print_to = stdout;
    }

    fprintf(print_to, "[");
    for (unsigned long cid = 0; cid < clusters.size(); cid++) {
      Vector *this_cluster = clusters[cid];
      if (cid) {
        fprintf(print_to, ",");
      }

      unsigned long max_nongap = 0UL, max_id = 0UL;

      fprintf(print_to, "\n\t{\n\t\t\"size\" : %ld, \n\t\t\"members\" : [",
              this_cluster->length());
      for (unsigned long p = 0; p < this_cluster->length(); p++) {
        fprintf(print_to, p ? ",\"%s\"" : "\"%s\"",
                stringText(names, nameLengths, this_cluster->value(p)));
        unsigned char *s = (unsigned char *)stringText(sequences, seqLengths,
                                                       this_cluster->value(p));
        unsigned long my_non_gap = 0UL;
        for (unsigned long ci = 0; ci < firstSequenceLength; ci++) {
          if (resolutionsCount[s[ci]] == 1.f) {
            my_non_gap++;
          }
        }
        if (my_non_gap > max_nongap) {
          max_nongap = my_non_gap;
          max_id = this_cluster->value(p);
        }
      }
      fprintf(print_to, "],\n\t\t\"centroid\" : \">%s\\n",
              stringText(names, nameLengths, max_id));
      dump_fasta(stringText(sequences, seqLengths, max_id), firstSequenceLength,
                 print_to, false);
      // dump_sequence_fasta (max_id, print_to, firstSequenceLength);
      fprintf(print_to, "\\n\"\n\t}");
    }
    fprintf(print_to, "\n]\n");

    if (args.trunk_path) {
      fclose(print_to);
    }

  } else {
    char *path_buffer = NULL;
    unsigned long pl = 0UL;
    if (args.trunk_path) {
      pl = strlen(args.trunk_path) + 128;
      path_buffer = new char[pl];
    }
    for (unsigned long cid = 0; cid < clusters.size(); cid++) {
      Vector *this_cluster = clusters[cid];

      FILE *print_to;

      if (args.trunk_path) {
        snprintf(path_buffer, pl, "%s.%lu", args.trunk_path, cid);
        // cout << path_buffer << endl;
        print_to = fopen(path_buffer, "w");
        if (!print_to) {
          cerr << "Failed to open '" << path_buffer << "' for writing" << endl;
          exit(0);
        }
      } else {
        print_to = stdout;
        cout << endl << "============================" << endl;
      }
      for (unsigned long p = 0; p < this_cluster->length(); p++) {
        long mapped_id = this_cluster->value(p);
        // cout << mapped_id << endl;
        dump_sequence_fasta(mapped_id, print_to, firstSequenceLength);
      }

      if (args.trunk_path) {
        fclose(print_to);
      }
    }
    if (args.trunk_path) {
      delete[] path_buffer;
    }
  }

  delete[] sequence_descriptors;
  return 0;
}